

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v8::detail::
iterator_buffer<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v8::detail::buffer_traits>
::grow(iterator_buffer<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v8::detail::buffer_traits>
       *this,size_t capacity)

{
  buffer<char>::try_resize(&this->container_->super_buffer<char>,capacity);
  (this->super_buffer<char>).ptr_ = (this->container_->super_buffer<char>).ptr_;
  (this->super_buffer<char>).capacity_ = capacity;
  return;
}

Assistant:

FMT_CONSTEXPR20 void grow(size_t capacity) override {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }